

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

NDeviceChannel * __thiscall
MlmWrap::findTrodesChannel
          (NDeviceChannel *__return_storage_ptr__,MlmWrap *this,NDevice *device,string *ch)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pNVar5;
  long *plVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  __it;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  _Var10;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> channelsvec;
  long *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 local_b8;
  long *local_b0;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  long local_58;
  undefined8 local_50;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> local_48;
  
  NDevice::getChannels(&local_48,device);
  pNVar5 = local_48.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_88 = local_78;
  pcVar1 = (ch->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + ch->_M_string_length);
  local_d0 = (long *)&local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_88,local_80 + (long)local_88);
  lVar9 = local_c8;
  local_58 = CONCAT71(uStack_bf,local_c0);
  local_68 = local_d0;
  plVar6 = (long *)&local_c0;
  if (local_d0 == (long *)&local_c0) {
    local_50 = local_b8;
    local_68 = &local_58;
    plVar6 = local_d0;
  }
  local_d0 = plVar6;
  local_b0 = &local_58;
  local_c0 = 0;
  local_c8 = 0;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,local_68,(undefined1 *)(lVar9 + (long)local_68));
  lVar9 = (long)pNVar5 -
          (long)local_48.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl
                .super__Vector_impl_data._M_start;
  __it._M_current =
       local_48.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (0 < lVar9 >> 8) {
    lVar8 = (lVar9 >> 8) + 1;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                          *)local_a8,__it);
      _Var10._M_current = __it._M_current;
      if (bVar7) goto LAB_00215550;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                          *)local_a8,__it._M_current + 1);
      _Var10._M_current = __it._M_current + 1;
      if (bVar7) goto LAB_00215550;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                          *)local_a8,__it._M_current + 2);
      _Var10._M_current = __it._M_current + 2;
      if (bVar7) goto LAB_00215550;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                          *)local_a8,__it._M_current + 3);
      _Var10._M_current = __it._M_current + 3;
      if (bVar7) goto LAB_00215550;
      __it._M_current = __it._M_current + 4;
      lVar8 = lVar8 + -1;
      lVar9 = lVar9 + -0x100;
    } while (1 < lVar8);
  }
  lVar9 = lVar9 >> 6;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      _Var10._M_current = pNVar5;
      if ((lVar9 != 3) ||
         (bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
                  operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                              *)local_a8,__it), _Var10._M_current = __it._M_current, bVar7))
      goto LAB_00215550;
      __it._M_current = __it._M_current + 1;
    }
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
            operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                        *)local_a8,__it);
    _Var10._M_current = __it._M_current;
    if (bVar7) goto LAB_00215550;
    __it._M_current = __it._M_current + 1;
  }
  bVar7 = __gnu_cxx::__ops::
          _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
          operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                      *)local_a8,__it);
  _Var10._M_current = pNVar5;
  if (bVar7) {
    _Var10._M_current = __it._M_current;
  }
LAB_00215550:
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_68 != local_b0) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_d0 != (long *)&local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (_Var10._M_current ==
      local_48.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    NDeviceChannel::NDeviceChannel(__return_storage_ptr__);
  }
  else {
    (__return_storage_ptr__->super_NetworkDataType)._vptr_NetworkDataType =
         (_func_int **)&PTR__NDeviceChannel_003ebd38;
    (__return_storage_ptr__->id)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->id).field_2;
    pcVar1 = ((_Var10._M_current)->id)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->id,pcVar1,
               pcVar1 + ((_Var10._M_current)->id)._M_string_length);
    __return_storage_ptr__->interleavedDataBit = (_Var10._M_current)->interleavedDataBit;
    iVar2 = (_Var10._M_current)->startBit;
    iVar3 = (_Var10._M_current)->type;
    iVar4 = (_Var10._M_current)->interleavedDataByte;
    __return_storage_ptr__->startByte = (_Var10._M_current)->startByte;
    __return_storage_ptr__->startBit = iVar2;
    __return_storage_ptr__->type = iVar3;
    __return_storage_ptr__->interleavedDataByte = iVar4;
  }
  std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

NDeviceChannel MlmWrap::findTrodesChannel(const NDevice& device, std::string ch){
    //Finding channel
//    NDevice* device = *deviceit;
    auto channelsvec = device.getChannels();
    auto channelit = std::find_if(channelsvec.begin(), channelsvec.end(),
                                  [ch](NDeviceChannel cha){return cha.getId() == ch;});
    if(channelit == channelsvec.end()){
        return NDeviceChannel();
    }
    return *channelit;
}